

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIso.c
# Opt level: O2

void Gia_IsoAssignOneClass(Gia_IsoMan_t *p,int fVerbose)

{
  undefined4 uVar1;
  undefined4 uVar2;
  Vec_Int_t *p_00;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  long lVar7;
  ulong uVar8;
  int nSizeNew;
  long lVar9;
  ulong uVar10;
  int iVar11;
  bool bVar12;
  
  iVar5 = p->vClasses->nSize;
  if (iVar5 < 1) {
    __assert_fail("Vec_IntSize(p->vClasses) > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaIso.c"
                  ,0x24f,"void Gia_IsoAssignOneClass(Gia_IsoMan_t *, int)");
  }
  iVar3 = Vec_IntEntry(p->vClasses,iVar5 + -2);
  iVar5 = p->vClasses->nSize;
  do {
    nSizeNew = iVar5;
    iVar11 = nSizeNew;
    if (nSizeNew < 2) {
      if (nSizeNew < 0) {
        __assert_fail("i >= 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaIso.c"
                      ,600,"void Gia_IsoAssignOneClass(Gia_IsoMan_t *, int)");
      }
      break;
    }
    iVar4 = Vec_IntEntry(p->vClasses,nSizeNew + -2);
    iVar5 = nSizeNew + -2;
  } while (p->pLevels[*(uint *)((long)p->pStoreW + (long)iVar4 * 8 + 4)] ==
           p->pLevels[*(uint *)((long)p->pStoreW + (long)iVar3 * 8 + 4)]);
  do {
    p_00 = p->vClasses;
    if (p_00->nSize <= iVar11) {
      Vec_IntShrink(p_00,nSizeNew);
      return;
    }
    iVar5 = Vec_IntEntry(p_00,iVar11);
    uVar6 = Vec_IntEntry(p->vClasses,iVar11 + 1);
    lVar7 = (long)iVar5;
    uVar8 = 0;
    lVar9 = lVar7;
    if (0 < (int)uVar6) {
      uVar8 = (ulong)uVar6;
    }
    while (bVar12 = uVar8 != 0, uVar8 = uVar8 - 1, bVar12) {
      uVar10 = p->pStoreW[lVar9] >> 0x20;
      if (p->pUniques[uVar10] != 0) {
        __assert_fail("p->pUniques[Gia_IsoGetItem(p, iBegin+k)] == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaIso.c"
                      ,0x260,"void Gia_IsoAssignOneClass(Gia_IsoMan_t *, int)");
      }
      iVar5 = p->nUniques;
      p->nUniques = iVar5 + 1;
      p->pUniques[uVar10] = iVar5;
      uVar1 = p->nSingles;
      uVar2 = p->nEntries;
      p->nSingles = uVar1 + 1;
      p->nEntries = uVar2 + -1;
      lVar9 = lVar9 + 1;
    }
    if (fVerbose != 0) {
      printf("Broke ties in class of size %d at level %d.\n",(ulong)uVar6,
             (ulong)(uint)p->pLevels[*(uint *)((long)p->pStoreW + lVar7 * 8 + 4)]);
    }
    iVar11 = iVar11 + 2;
  } while( true );
}

Assistant:

void Gia_IsoAssignOneClass( Gia_IsoMan_t * p, int fVerbose )
{
    int i, k, iBegin0, iBegin, nSize, Shrink;
    // find the classes with the highest level
    assert( Vec_IntSize(p->vClasses) > 0 );
    iBegin0 = Vec_IntEntry( p->vClasses, Vec_IntSize(p->vClasses) - 2 );
    for ( i = Vec_IntSize(p->vClasses) - 2; i >= 0; i -= 2 )
    {
        iBegin = Vec_IntEntry( p->vClasses, i );
        if ( p->pLevels[Gia_IsoGetItem(p, iBegin)] != p->pLevels[Gia_IsoGetItem(p, iBegin0)] )
            break;
    }
    i += 2;
    assert( i >= 0 );
    // assign all classes starting with this one
    for ( Shrink = i; i < Vec_IntSize(p->vClasses); i += 2 )
    {
        iBegin = Vec_IntEntry( p->vClasses, i );
        nSize  = Vec_IntEntry( p->vClasses, i + 1 );
        for ( k = 0; k < nSize; k++ )
        {
            assert( p->pUniques[Gia_IsoGetItem(p, iBegin+k)] == 0 );
            p->pUniques[Gia_IsoGetItem(p, iBegin+k)] = p->nUniques++;
//            Gia_ManObj(p->pGia, Gia_IsoGetItem(p, iBegin+k))->Value += s_256Primes[0]; ///  new addition!!!
            p->nSingles++;
            p->nEntries--;
        }
        if ( fVerbose )
            printf( "Broke ties in class of size %d at level %d.\n", nSize, p->pLevels[Gia_IsoGetItem(p, iBegin)] );
    }
    Vec_IntShrink( p->vClasses, Shrink );
}